

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O2

int cfg_validate_bitmap256(autobuf *out,char *section_name,char *entry_name,char *value)

{
  int iVar1;
  char *in_RAX;
  int *piVar2;
  long lVar3;
  int iVar4;
  char *end;
  
  end = in_RAX;
  iVar1 = strcasecmp(value,"all");
  iVar4 = 0;
  if ((iVar1 != 0) && (iVar1 = strcasecmp(value,"none"), iVar1 != 0)) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(value,&end,10);
    if ((*piVar2 != 0) || ((*end != '\0' || (iVar4 = 0, (int)lVar3 - 0x100U < 0xfffffe01)))) {
      cfg_append_printable_line
                (out,
                 "Value \'%s\' for entry \'%s\' in section %s must be a \'all\', \'none\' or a number between 0 and 255 (with optional \'-\' in front of the number)"
                 ,value,entry_name,section_name);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

int
cfg_validate_bitmap256(struct autobuf *out, const char *section_name, const char *entry_name, const char *value) {
  int num;
  char *end;

  if (strcasecmp(value, "all") == 0 || strcasecmp(value, "none") == 0) {
    return 0;
  }

  errno = 0;
  num = strtol(value, &end, 10);
  if (errno != 0 || *end != 0 || num < -255 || num > 255) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s must be a '" BITMAP256_ALL "', '" BITMAP256_NONE "' or a number between 0 and 255"
      " (with optional '-' in front of the number)",
      value, entry_name, section_name);
    return -1;
  }
  return 0;
}